

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void pstack::print_container<pstack::Elf::Notes,char_const&>(ostream *os,Notes *container,char *ctx)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  bool bVar1;
  ostream *os_00;
  char *pcVar2;
  undefined1 local_e0 [8];
  iterator __begin0;
  iterator __end0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  JSON<pstack::Elf::NoteDesc,_char> local_40;
  
  std::operator<<(os,"[ ");
  Elf::Notes::begin((iterator *)local_e0,container);
  Elf::Notes::end((iterator *)
                  &__begin0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,container);
  pcVar2 = "";
  __return_storage_ptr__ =
       &__end0.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  while( true ) {
    bVar1 = Elf::Notes::iterator::operator!=
                      ((iterator *)local_e0,
                       (iterator *)
                       &__begin0.io.
                        super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (!bVar1) break;
    Elf::Notes::iterator::operator*((NoteDesc *)__return_storage_ptr__,(iterator *)local_e0);
    os_00 = std::operator<<(os,pcVar2);
    local_40.object = (NoteDesc *)__return_storage_ptr__;
    local_40.context = ctx;
    operator<<(os_00,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    Elf::Notes::iterator::operator++((iterator *)local_e0);
    pcVar2 = ",\n";
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__end0.io);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__begin0.io);
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}